

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O2

void anon_unknown.dwarf_132aa1::testWriteRead(int partNumber)

{
  Header *pHVar1;
  char cVar2;
  __type _Var3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ostream *poVar11;
  char *pcVar12;
  uint *puVar13;
  int *piVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  int local_340;
  ulong local_338;
  int local_328;
  DeepScanLineOutputPart part_1;
  Array2D<unsigned_int> sampleCount;
  Header header;
  MultiPartOutputFile file;
  Array2D<unsigned_int_*> deepUintData;
  Array2D<float_*> deepFloatData;
  Array2D<Imath_3_2::half_*> deepHalfData;
  Array2D<unsigned_int> uintData;
  Array2D<float> floatData;
  Array2D<Imath_3_2::half> halfData;
  vector<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_> outputfiles;
  stringstream ss;
  _Rb_tree_node_base local_1b0;
  size_t local_190;
  
  uVar17 = (ulong)(uint)partNumber;
  poVar11 = std::operator<<((ostream *)&std::cout,"Testing file with ");
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,partNumber);
  poVar11 = std::operator<<(poVar11," part(s).");
  std::endl<char,std::char_traits<char>>(poVar11);
  std::ostream::flush();
  uVar18 = uVar17;
  if (partNumber < 1) {
    uVar18 = 0;
  }
  halfData._sizeX = 0;
  halfData._sizeY = 0;
  halfData._data = (half *)0x0;
  floatData._sizeX = 0;
  floatData._sizeY = 0;
  floatData._data = (float *)0x0;
  uintData._sizeX = 0;
  uintData._sizeY = 0;
  uintData._data = (uint *)0x0;
  sampleCount._sizeX = 0;
  sampleCount._sizeY = 0;
  sampleCount._data = (uint *)0x0;
  deepHalfData._sizeX = 0;
  deepHalfData._sizeY = 0;
  deepHalfData._data = (half **)0x0;
  deepFloatData._sizeX = 0;
  deepFloatData._sizeY = 0;
  deepFloatData._data = (float **)0x0;
  deepUintData._sizeX = 0;
  deepUintData._sizeY = 0;
  deepUintData._data = (uint **)0x0;
  outputfiles.
  super__Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputfiles.
  super__Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputfiles.
  super__Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::pixelTypes,uVar17);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::partTypes,uVar17);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::levelModes,uVar17);
  poVar11 = std::operator<<((ostream *)&std::cout,"Generating headers and data");
  std::endl<char,std::char_traits<char>>(poVar11);
  std::ostream::flush();
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::clear
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
             &(anonymous_namespace)::headers);
  local_328 = 0;
  lVar16 = 0;
  do {
    if (uVar18 * 4 - lVar16 == 0) {
      remove((anonymous_namespace)::filename_abi_cxx11_);
      lVar16 = DAT_001d18a0;
      pHVar1 = (anonymous_namespace)::headers;
      pcVar12 = (anonymous_namespace)::filename_abi_cxx11_;
      iVar4 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                (&file,pcVar12,pHVar1,(int)((lVar16 - (long)pHVar1) / 0x38),false,iVar4);
      std::operator<<((ostream *)&std::cout,"Writing files ");
      std::ostream::flush();
      for (local_338 = 0; local_338 != uVar18; local_338 = local_338 + 1) {
        iVar4 = (int)local_338;
        switch(*(undefined4 *)((anonymous_namespace)::partTypes + local_338 * 4)) {
        case 0:
          Imf_3_4::OutputPart::OutputPart((OutputPart *)&header,&file,iVar4);
          local_1b0._M_color = _S_red;
          local_1b0._M_parent = (_Base_ptr)0x0;
          local_1b0._M_left = &local_1b0;
          local_190 = 0;
          local_1b0._M_right = local_1b0._M_left;
          fillPixels<unsigned_int>(&uintData,0x10,0x10);
          fillPixels<float>(&floatData,0x10,0x10);
          fillPixels<Imath_3_2::half>(&halfData,0x10,0x10);
          setOutputFrameBuffer
                    ((FrameBuffer *)&ss,*(int *)((anonymous_namespace)::pixelTypes + local_338 * 4),
                     &uintData,&floatData,&halfData,0x10);
          Imf_3_4::OutputPart::setFrameBuffer((FrameBuffer *)&header);
          Imf_3_4::OutputPart::writePixels((int)&header);
          std::
          _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                       *)&ss);
          break;
        case 1:
          Imf_3_4::TiledOutputPart::TiledOutputPart((TiledOutputPart *)&header,&file,iVar4);
          iVar4 = Imf_3_4::TiledOutputPart::numXLevels();
          iVar6 = Imf_3_4::TiledOutputPart::numYLevels();
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          local_340 = 0;
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          for (; local_340 != iVar4; local_340 = local_340 + 1) {
            for (iVar7 = 0; iVar6 != iVar7; iVar7 = iVar7 + 1) {
              cVar2 = Imf_3_4::TiledOutputPart::isValidLevel((int)&header,local_340);
              if (cVar2 != '\0') {
                iVar9 = Imf_3_4::TiledOutputPart::levelWidth((int)&header);
                iVar10 = Imf_3_4::TiledOutputPart::levelHeight((int)&header);
                local_1b0._M_color = _S_red;
                local_1b0._M_parent = (_Base_ptr)0x0;
                local_1b0._M_left = &local_1b0;
                local_190 = 0;
                local_1b0._M_right = local_1b0._M_left;
                fillPixels<unsigned_int>(&uintData,iVar9,iVar10);
                fillPixels<float>(&floatData,iVar9,iVar10);
                fillPixels<Imath_3_2::half>(&halfData,iVar9,iVar10);
                setOutputFrameBuffer
                          ((FrameBuffer *)&ss,
                           *(int *)((anonymous_namespace)::pixelTypes + local_338 * 4),&uintData,
                           &floatData,&halfData,iVar9);
                Imf_3_4::TiledOutputPart::setFrameBuffer((FrameBuffer *)&header);
                iVar9 = Imf_3_4::TiledOutputPart::numXTiles((int)&header);
                iVar10 = Imf_3_4::TiledOutputPart::numYTiles((int)&header);
                Imf_3_4::TiledOutputPart::writeTiles
                          ((int)&header,0,iVar9 + -1,0,iVar10 + -1,local_340);
                std::
                _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                             *)&ss);
              }
            }
          }
          break;
        case 2:
          Imf_3_4::DeepScanLineOutputPart::DeepScanLineOutputPart(&part_1,&file,iVar4);
          Imf_3_4::DeepFrameBuffer::DeepFrameBuffer((DeepFrameBuffer *)&ss);
          Imf_3_4::Array2D<unsigned_int>::resizeErase(&sampleCount,0x10,0x10);
          uVar17 = 0;
          iVar4 = 1;
          puVar13 = sampleCount._data;
          for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
            iVar7 = (int)uVar17;
            lVar22 = 0;
            iVar6 = iVar4;
            while( true ) {
              if (lVar22 == 0x10) break;
              puVar13[lVar22] = iVar6 + (int)(uVar17 / 10) * -10;
              lVar22 = lVar22 + 1;
              iVar6 = iVar6 + 1;
              uVar17 = (ulong)((int)uVar17 + 1);
            }
            iVar4 = iVar4 + 0x10;
            uVar17 = (ulong)(iVar7 + 0x10);
            puVar13 = puVar13 + sampleCount._sizeY;
          }
          Imf_3_4::Slice::Slice
                    ((Slice *)&header,UINT,(char *)sampleCount._data,4,0x40,1,1,0.0,false,false);
          Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&ss);
          iVar4 = *(int *)((anonymous_namespace)::pixelTypes + local_338 * 4);
          if (iVar4 == 0) {
            fillPixels<unsigned_int>(&sampleCount,&deepUintData,0x10,0x10);
            iVar4 = *(int *)((anonymous_namespace)::pixelTypes + local_338 * 4);
          }
          if (iVar4 == 1) {
            fillPixels<float>(&sampleCount,&deepFloatData,0x10,0x10);
            iVar4 = *(int *)((anonymous_namespace)::pixelTypes + local_338 * 4);
          }
          if (iVar4 == 2) {
            fillPixels<Imath_3_2::half>(&sampleCount,&deepHalfData,0x10,0x10);
            iVar4 = *(int *)((anonymous_namespace)::pixelTypes + local_338 * 4);
          }
          setOutputDeepFrameBuffer
                    ((DeepFrameBuffer *)&ss,iVar4,&deepUintData,&deepFloatData,&deepHalfData,0x10);
          Imf_3_4::DeepScanLineOutputPart::setFrameBuffer((DeepFrameBuffer *)&part_1);
          Imf_3_4::DeepScanLineOutputPart::writePixels((int)&part_1);
          releasePixels(*(int *)((anonymous_namespace)::pixelTypes + local_338 * 4),&deepUintData,
                        &deepFloatData,&deepHalfData,0x10,0x10);
          std::
          _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                       *)&ss);
          break;
        case 3:
          Imf_3_4::DeepTiledOutputPart::DeepTiledOutputPart
                    ((DeepTiledOutputPart *)&part_1,&file,iVar4);
          iVar4 = Imf_3_4::DeepTiledOutputPart::numXLevels();
          iVar6 = Imf_3_4::DeepTiledOutputPart::numYLevels();
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          local_328 = 0;
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          for (; local_328 != iVar4; local_328 = local_328 + 1) {
            for (iVar7 = 0; iVar7 != iVar6; iVar7 = iVar7 + 1) {
              cVar2 = Imf_3_4::DeepTiledOutputPart::isValidLevel((int)&part_1,local_328);
              if (cVar2 != '\0') {
                uVar5 = Imf_3_4::DeepTiledOutputPart::levelWidth((int)&part_1);
                uVar21 = Imf_3_4::DeepTiledOutputPart::levelHeight((int)&part_1);
                Imf_3_4::DeepFrameBuffer::DeepFrameBuffer((DeepFrameBuffer *)&ss);
                Imf_3_4::Array2D<unsigned_int>::resizeErase
                          (&sampleCount,(long)(int)uVar21,(long)(int)uVar5);
                uVar17 = 0;
                if (0 < (int)uVar5) {
                  uVar17 = (ulong)uVar5;
                }
                uVar8 = uVar21;
                if ((int)uVar21 < 1) {
                  uVar8 = 0;
                }
                iVar9 = 0;
                lVar16 = 0;
                for (uVar20 = 0; uVar20 != uVar8; uVar20 = uVar20 + 1) {
                  for (uVar23 = 0; uVar17 != uVar23; uVar23 = uVar23 + 1) {
                    *(int *)((long)sampleCount._data + uVar23 * 4 + sampleCount._sizeY * lVar16) =
                         (iVar9 + (int)uVar23) % 10 + 1;
                  }
                  lVar16 = lVar16 + 4;
                  iVar9 = iVar9 + uVar5;
                }
                Imf_3_4::Slice::Slice
                          ((Slice *)&header,UINT,(char *)sampleCount._data,4,(long)(int)uVar5 << 2,1
                           ,1,0.0,false,false);
                Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&ss);
                iVar9 = *(int *)((anonymous_namespace)::pixelTypes + local_338 * 4);
                if (iVar9 == 0) {
                  fillPixels<unsigned_int>(&sampleCount,&deepUintData,uVar5,uVar21);
                  iVar9 = *(int *)((anonymous_namespace)::pixelTypes + local_338 * 4);
                }
                if (iVar9 == 1) {
                  fillPixels<float>(&sampleCount,&deepFloatData,uVar5,uVar21);
                  iVar9 = *(int *)((anonymous_namespace)::pixelTypes + local_338 * 4);
                }
                if (iVar9 == 2) {
                  fillPixels<Imath_3_2::half>(&sampleCount,&deepHalfData,uVar5,uVar21);
                  iVar9 = *(int *)((anonymous_namespace)::pixelTypes + local_338 * 4);
                }
                setOutputDeepFrameBuffer
                          ((DeepFrameBuffer *)&ss,iVar9,&deepUintData,&deepFloatData,&deepHalfData,
                           uVar5);
                Imf_3_4::DeepTiledOutputPart::setFrameBuffer((DeepFrameBuffer *)&part_1);
                iVar19 = (int)(DeepFrameBuffer *)&part_1;
                iVar9 = Imf_3_4::DeepTiledOutputPart::numXTiles(iVar19);
                iVar10 = Imf_3_4::DeepTiledOutputPart::numYTiles(iVar19);
                Imf_3_4::DeepTiledOutputPart::writeTiles
                          (iVar19,0,iVar9 + -1,0,iVar10 + -1,local_328);
                releasePixels(*(int *)((anonymous_namespace)::pixelTypes + local_338 * 4),
                              &deepUintData,&deepFloatData,&deepHalfData,uVar5,uVar21);
                std::
                _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                             *)&ss);
              }
            }
          }
        }
      }
      Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(&file);
      std::_Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>
      ::~_Vector_base(&outputfiles.
                       super__Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>
                     );
      Imf_3_4::Array2D<unsigned_int_*>::~Array2D(&deepUintData);
      Imf_3_4::Array2D<float_*>::~Array2D(&deepFloatData);
      Imf_3_4::Array2D<Imath_3_2::half_*>::~Array2D(&deepHalfData);
      Imf_3_4::Array2D<unsigned_int>::~Array2D(&sampleCount);
      Imf_3_4::Array2D<unsigned_int>::~Array2D(&uintData);
      Imf_3_4::Array2D<float>::~Array2D(&floatData);
      Imf_3_4::Array2D<Imath_3_2::half>::~Array2D(&halfData);
      readFirstPart();
      readWholeFiles(0);
      pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Imf_3_4::Header::type_abi_cxx11_();
      _Var3 = std::operator==(pbVar15,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)Imf_3_4::DEEPSCANLINE_abi_cxx11_);
      if (!_Var3) {
        pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Imf_3_4::Header::type_abi_cxx11_();
        _Var3 = std::operator==(pbVar15,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)Imf_3_4::DEEPTILE_abi_cxx11_);
        if (!_Var3) {
          modifyType(false);
          readFirstPart();
          std::operator<<((ostream *)&std::cerr," part reading succeeded but should have failed\n");
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                        ,0x5fd,"void (anonymous namespace)::testWriteRead(int)");
        }
      }
      modifyType(true);
      readFirstPart();
      std::operator<<((ostream *)&std::cerr," part reading succeeded but should have failed\n");
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x5e9,"void (anonymous namespace)::testWriteRead(int)");
    }
    _ss = 0;
    Imf_3_4::Header::Header(&header,0x10,0x10,1.0,(Vec2 *)&ss,1.0,INCREASING_Y,ZIPS_COMPRESSION);
    iVar4 = random_int(3);
    uVar5 = random_int(4);
    *(int *)((anonymous_namespace)::pixelTypes + lVar16) = iVar4;
    *(uint *)((anonymous_namespace)::partTypes + lVar16) = uVar5;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::operator<<(&local_1b0._M_parent,local_328);
    std::__cxx11::stringbuf::str();
    Imf_3_4::Header::setName((string *)&header);
    std::__cxx11::string::~string((string *)&file);
    if (iVar4 == 0) {
      pcVar12 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&file,UINT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar12,(Channel *)"UINT");
    }
    else if (iVar4 == 1) {
      pcVar12 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&file,FLOAT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar12,(Channel *)"FLOAT");
    }
    else if (iVar4 == 2) {
      pcVar12 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&file,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar12,(Channel *)"HALF");
    }
    switch(uVar5) {
    case 2:
    case 0:
      Imf_3_4::Header::setType((string *)&header);
      uVar21 = uVar5 & 0xfffffffd;
      break;
    case 3:
    case 1:
      Imf_3_4::Header::setType((string *)&header);
      uVar8 = uVar5 & 0xfffffffd;
LAB_0015274d:
      uVar21 = uVar8;
      iVar6 = random_int(0x10);
      random_int(0x10);
      iVar7 = random_int(3);
      _file = iVar6 + 1;
      *(int *)((anonymous_namespace)::levelModes + lVar16) = iVar7;
      Imf_3_4::Header::setTileDescription((TileDescription *)&header);
      break;
    default:
      uVar21 = uVar5 & 0xfffffffd;
      uVar8 = 1;
      if (uVar21 == 1) goto LAB_0015274d;
    }
    uVar8 = random_int(3);
    if (uVar21 == 0) {
      uVar8 = random_int(2);
    }
    puVar13 = (uint *)Imf_3_4::Header::lineOrder();
    if (2 < uVar8) {
      uVar8 = 3;
    }
    *puVar13 = uVar8;
    if (uVar21 == 0) {
      poVar11 = std::operator<<((ostream *)&std::cout,"pixelType = ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar4);
      poVar11 = std::operator<<(poVar11," partType = ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar5);
      poVar11 = std::operator<<(poVar11," line order =");
      piVar14 = (int *)Imf_3_4::Header::lineOrder();
    }
    else {
      poVar11 = std::operator<<((ostream *)&std::cout,"pixelType = ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar4);
      poVar11 = std::operator<<(poVar11," partType = ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar5);
      poVar11 = std::operator<<(poVar11," tile order =");
      piVar14 = (int *)Imf_3_4::Header::lineOrder();
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,*piVar14);
      poVar11 = std::operator<<(poVar11," levelMode = ");
      piVar14 = (int *)((anonymous_namespace)::levelModes + lVar16);
    }
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,*piVar14);
    std::endl<char,std::char_traits<char>>(poVar11);
    std::ostream::flush();
    Imf_3_4::getChunkOffsetTableSize(&header);
    Imf_3_4::Header::setChunkCount((int)&header);
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               &(anonymous_namespace)::headers,&header);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    Imf_3_4::Header::~Header(&header);
    lVar16 = lVar16 + 4;
    local_328 = local_328 + 1;
  } while( true );
}

Assistant:

void
testWriteRead (int partNumber)
{
    cout << "Testing file with " << partNumber << " part(s)." << endl << flush;

    for (int i = 0; i < 40; i++)
    {
        generateRandomFile (partNumber);

        try
        {
            readFirstPart ();
        }
        catch (std::exception& e)
        {
            cerr << " part reading failed with " << e.what ()
                 << " but should have succeeded\n";
            assert (false);
        }

        readWholeFiles (0);

        bool caught = false;

        // for deep images, check that "version 2" files don't load
        if (headers[0].type () == DEEPSCANLINE ||
            headers[0].type () == DEEPTILE)
        {
            modifyType (true);
            try
            {
                caught = false;
                readFirstPart ();
                cerr << " part reading succeeded but should have failed\n";
                assert (false);
            }
            catch (std::exception& e)
            {
                cout << "received exception (" << e.what ()
                     << ") as expected\n";
                caught = true;
                // that's what we thought would happen
            }
            assert (caught);
            readWholeFiles (2);
        }

        modifyType (false);

        try
        {
            caught = false;
            readFirstPart ();
            cerr << " part reading succeeded but should have failed\n";
            assert (false);
        }
        catch (std::exception& e)
        {
            cout << "received exception (" << e.what () << ") as expected\n";
            caught = true;
            // that's what we thought would happen
        }
        assert (caught);

        // this should always succeed: it doesn't try to read the strange new type in part 0
        readWholeFiles (1);

        remove (filename.c_str ());
        cout << endl << flush;
    }
}